

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.c
# Opt level: O2

int jump_label(char *src,char *base)

{
  byte bVar1;
  short sVar2;
  int iVar3;
  
  do {
    iVar3 = 0;
    while( true ) {
      sVar2 = (short)iVar3;
      bVar1 = src[sVar2];
      if (bVar1 == 0) {
        return (int)sVar2;
      }
      if (0x3f < bVar1) break;
      iVar3 = (int)sVar2 + (uint)bVar1 + 1;
    }
    src = base + (ushort)((*(ushort *)(src + sVar2) & 0xff3f) << 8 | *(ushort *)(src + sVar2) >> 8);
  } while( true );
}

Assistant:

int jump_label(char *src, char *base){
  short now = 0;
  short i = 0;
  short next = 0;
  while (src[now] != 0) {
    // printf("%d ",now);fflush(stdout);
    if (is_compress(src[now])) {
      unsigned short pos =
          get_compress_pos(ntohs(*(const unsigned short *)(src + now)));
      // printf("pos=%d ",pos);fflush(stdout);
      next = now + 2;
      return jump_label(base + pos, base);
    } else {
      // printf(" bbb ");fflush(stdout);
      now += src[now] + 1;
    }
  }
  next = now;
  return next;
}